

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int parse_record(ptls_t *tls,st_ptls_record_t *rec,uint8_t *src,size_t *len)

{
  undefined1 uVar1;
  long lVar2;
  int iVar3;
  ptls_buffer_t *buf;
  ulong *in_RCX;
  undefined1 *in_RDX;
  ptls_buffer_t *in_RSI;
  long in_RDI;
  size_t addlen;
  uint8_t *end;
  int ret;
  st_ptls_record_t *in_stack_ffffffffffffff98;
  ptls_buffer_t *buf_00;
  ptls_buffer_t *in_stack_ffffffffffffffa8;
  uint8_t *local_50;
  size_t local_48;
  size_t local_40;
  undefined1 *local_38;
  int local_2c;
  ulong *local_28;
  undefined1 *local_20;
  ptls_buffer_t *local_18;
  long local_10;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((*(long *)(in_RDI + 0x10) == 0) && (4 < *in_RCX)) {
    iVar3 = parse_record_header(in_stack_ffffffffffffff98,(uint8_t *)0x118cae);
    if (iVar3 != 0) {
      return iVar3;
    }
    if (local_18->capacity + 5 <= *local_28) {
      local_18->off = (size_t)(local_20 + 5);
      *local_28 = local_18->capacity + 5;
      return 0;
    }
    local_2c = 0;
  }
  local_38 = local_20 + *local_28;
  buf_00 = local_18;
  memset(&local_50,0,0x18);
  buf_00->base = local_50;
  buf_00->capacity = local_48;
  buf_00->off = local_40;
  if (*(long *)(local_10 + 0x10) == 0) {
    ptls_buffer_init(buf_00,in_stack_ffffffffffffff98,0x118d82);
    iVar3 = ptls_buffer_reserve(in_stack_ffffffffffffffa8,(size_t)buf_00);
    if (iVar3 != 0) {
      return iVar3;
    }
    local_2c = 0;
  }
  while (*(ulong *)(local_10 + 0x20) < 5) {
    if (local_20 == local_38) {
      return 0x202;
    }
    uVar1 = *local_20;
    lVar2 = *(long *)(local_10 + 0x20);
    *(long *)(local_10 + 0x20) = lVar2 + 1;
    *(undefined1 *)(*(long *)(local_10 + 0x10) + lVar2) = uVar1;
    local_20 = local_20 + 1;
  }
  local_2c = parse_record_header(in_stack_ffffffffffffff98,(uint8_t *)0x118e1c);
  local_4 = local_2c;
  if (local_2c == 0) {
    buf = (ptls_buffer_t *)((local_18->capacity + 5) - *(long *)(local_10 + 0x20));
    if (buf != (ptls_buffer_t *)0x0) {
      local_2c = ptls_buffer_reserve(buf,(size_t)buf_00);
      if (local_2c != 0) {
        return local_2c;
      }
      if ((ptls_buffer_t *)(local_38 + -(long)local_20) < buf) {
        buf = (ptls_buffer_t *)(local_38 + -(long)local_20);
      }
      if (buf != (ptls_buffer_t *)0x0) {
        memcpy((void *)(*(long *)(local_10 + 0x10) + *(long *)(local_10 + 0x20)),local_20,
               (size_t)buf);
        *(undefined1 **)(local_10 + 0x20) =
             (undefined1 *)((long)&buf->base + *(long *)(local_10 + 0x20));
        local_20 = local_20 + (long)&buf->base;
      }
    }
    if (*(long *)(local_10 + 0x20) == local_18->capacity + 5) {
      local_18->off = *(long *)(local_10 + 0x10) + 5;
      local_2c = 0;
    }
    else {
      local_2c = 0x202;
    }
    *local_28 = *local_28 - ((long)local_38 - (long)local_20);
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static int parse_record(ptls_t *tls, struct st_ptls_record_t *rec, const uint8_t *src, size_t *len)
{
    int ret;

    if (tls->recvbuf.rec.base == NULL && *len >= 5) {
        /* fast path */
        if ((ret = parse_record_header(rec, src)) != 0)
            return ret;
        if (5 + rec->length <= *len) {
            rec->fragment = src + 5;
            *len = rec->length + 5;
            return 0;
        }
    }

    /* slow path */
    const uint8_t *const end = src + *len;
    *rec = (struct st_ptls_record_t){0};

    if (tls->recvbuf.rec.base == NULL) {
        ptls_buffer_init(&tls->recvbuf.rec, "", 0);
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.rec, 5)) != 0)
            return ret;
    }

    /* fill and parse the header */
    while (tls->recvbuf.rec.off < 5) {
        if (src == end)
            return PTLS_ERROR_IN_PROGRESS;
        tls->recvbuf.rec.base[tls->recvbuf.rec.off++] = *src++;
    }
    if ((ret = parse_record_header(rec, tls->recvbuf.rec.base)) != 0)
        return ret;

    /* fill the fragment */
    size_t addlen = rec->length + 5 - tls->recvbuf.rec.off;
    if (addlen != 0) {
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.rec, addlen)) != 0)
            return ret;
        if (addlen > (size_t)(end - src))
            addlen = end - src;
        if (addlen != 0) {
            memcpy(tls->recvbuf.rec.base + tls->recvbuf.rec.off, src, addlen);
            tls->recvbuf.rec.off += addlen;
            src += addlen;
        }
    }

    /* set rec->fragment if a complete record has been parsed */
    if (tls->recvbuf.rec.off == rec->length + 5) {
        rec->fragment = tls->recvbuf.rec.base + 5;
        ret = 0;
    } else {
        ret = PTLS_ERROR_IN_PROGRESS;
    }

    *len -= end - src;
    return ret;
}